

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O1

int get_topology(msr_topology *topo,uint32_t ncpus)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  uint32_t *puVar4;
  ulong uVar5;
  char fname [92];
  char local_128 [96];
  stat local_c8;
  
  if (ncpus == 0) {
    return 0;
  }
  puVar4 = &topo->die;
  uVar5 = 0;
  do {
    local_c8.st_atim.tv_nsec._0_4_ = 0;
    local_c8._84_8_ = 0;
    local_c8.st_blocks = 0;
    local_c8.st_atim.tv_sec._0_4_ = 0;
    local_c8.st_atim.tv_sec._4_4_ = 0;
    local_c8.st_size = 0;
    local_c8.st_blksize = 0;
    local_c8.st_gid = 0;
    local_c8.__pad0 = 0;
    local_c8.st_rdev = 0;
    local_c8.st_nlink = 0;
    local_c8.st_mode = 0;
    local_c8.st_uid = 0;
    local_c8.st_dev = 0;
    local_c8.st_ino = 0;
    snprintf((char *)&local_c8,0x5c,"/sys/devices/system/cpu/cpu%u/topology/physical_package_id",
             uVar5 & 0xffffffff);
    pFVar3 = fopen((char *)&local_c8,"r");
    if (pFVar3 == (FILE *)0x0) {
      get_topology_cold_6();
      return -1;
    }
    iVar1 = __isoc99_fscanf(pFVar3,"%u",(msr_topology *)(puVar4 + -1));
    iVar2 = fclose(pFVar3);
    if (iVar2 != 0) {
      get_topology_cold_1();
    }
    if (iVar1 != 1) {
      get_topology_cold_2();
      return -1;
    }
    local_128[0x50] = '\0';
    local_128[0x51] = '\0';
    local_128[0x52] = '\0';
    local_128[0x53] = '\0';
    local_128[0x54] = '\0';
    local_128[0x55] = '\0';
    local_128[0x56] = '\0';
    local_128[0x57] = '\0';
    local_128[0x58] = '\0';
    local_128[0x59] = '\0';
    local_128[0x5a] = '\0';
    local_128[0x5b] = '\0';
    local_128[0x40] = '\0';
    local_128[0x41] = '\0';
    local_128[0x42] = '\0';
    local_128[0x43] = '\0';
    local_128[0x44] = '\0';
    local_128[0x45] = '\0';
    local_128[0x46] = '\0';
    local_128[0x47] = '\0';
    local_128[0x48] = '\0';
    local_128[0x49] = '\0';
    local_128[0x4a] = '\0';
    local_128[0x4b] = '\0';
    local_128[0x4c] = '\0';
    local_128[0x4d] = '\0';
    local_128[0x4e] = '\0';
    local_128[0x4f] = '\0';
    local_128[0x30] = '\0';
    local_128[0x31] = '\0';
    local_128[0x32] = '\0';
    local_128[0x33] = '\0';
    local_128[0x34] = '\0';
    local_128[0x35] = '\0';
    local_128[0x36] = '\0';
    local_128[0x37] = '\0';
    local_128[0x38] = '\0';
    local_128[0x39] = '\0';
    local_128[0x3a] = '\0';
    local_128[0x3b] = '\0';
    local_128[0x3c] = '\0';
    local_128[0x3d] = '\0';
    local_128[0x3e] = '\0';
    local_128[0x3f] = '\0';
    local_128[0x20] = '\0';
    local_128[0x21] = '\0';
    local_128[0x22] = '\0';
    local_128[0x23] = '\0';
    local_128[0x24] = '\0';
    local_128[0x25] = '\0';
    local_128[0x26] = '\0';
    local_128[0x27] = '\0';
    local_128[0x28] = '\0';
    local_128[0x29] = '\0';
    local_128[0x2a] = '\0';
    local_128[0x2b] = '\0';
    local_128[0x2c] = '\0';
    local_128[0x2d] = '\0';
    local_128[0x2e] = '\0';
    local_128[0x2f] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    local_128[0x18] = '\0';
    local_128[0x19] = '\0';
    local_128[0x1a] = '\0';
    local_128[0x1b] = '\0';
    local_128[0x1c] = '\0';
    local_128[0x1d] = '\0';
    local_128[0x1e] = '\0';
    local_128[0x1f] = '\0';
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '\0';
    local_128[9] = '\0';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    snprintf(local_128,0x5c,"/sys/devices/system/cpu/cpu%u/topology/die_id",uVar5 & 0xffffffff);
    iVar1 = stat(local_128,&local_c8);
    if (iVar1 == 0) {
      pFVar3 = fopen(local_128,"r");
      if (pFVar3 == (FILE *)0x0) {
        get_topology_cold_5();
        return -1;
      }
      iVar1 = __isoc99_fscanf(pFVar3,"%u",puVar4);
      iVar2 = fclose(pFVar3);
      if (iVar2 != 0) {
        get_topology_cold_3();
      }
      if (iVar1 != 1) {
        get_topology_cold_4();
        return -1;
      }
    }
    else {
      *puVar4 = 0;
    }
    puVar4[1] = (uint32_t)uVar5;
    uVar5 = uVar5 + 1;
    puVar4 = puVar4 + 3;
    if (ncpus == uVar5) {
      return 0;
    }
  } while( true );
}

Assistant:

static int get_topology(msr_topology* topo, uint32_t ncpus) {
  // assumes cpus are numbered from 0 to ncpus-1
  uint32_t i;
  for (i = 0; i < ncpus; i++) {
    if (get_physical_package_id(i, &topo[i].pkg) < 0) {
      return -1;
    }
    if (get_die_id(i, &topo[i].die) < 0) {
      return -1;
    }
    topo[i].cpu = i;
  }
  return 0;
}